

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O2

void secp256k1_ecmult(secp256k1_gej *r,secp256k1_gej *a,secp256k1_scalar *na,secp256k1_scalar *ng)

{
  uint64_t *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int w;
  long lVar5;
  secp256k1_fe *psVar6;
  long lVar7;
  secp256k1_fe *psVar8;
  long lVar9;
  secp256k1_gej *psVar10;
  secp256k1_ge *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_ge *psVar13;
  secp256k1_ge *psVar14;
  long lVar15;
  secp256k1_fe *bzinv;
  int *piVar16;
  bool bVar17;
  byte bVar18;
  uint local_d44;
  secp256k1_ge local_d28;
  secp256k1_fe Z;
  uint64_t local_ca8;
  uint64_t uStack_ca0;
  undefined1 local_c98 [16];
  uint64_t local_c88;
  uint64_t uStack_c80;
  undefined1 local_c78 [16];
  secp256k1_fe aux [8];
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  bVar18 = 0;
  Z.n[0] = 1;
  Z.n[1] = 0;
  Z.n[2] = 0;
  Z.n[3] = 0;
  Z.n[4] = 0;
  bVar17 = true;
  bzinv = (secp256k1_fe *)0x0;
  lVar15 = 0;
  psVar6 = (secp256k1_fe *)ng;
  while (uVar4 = (uint)bzinv, bVar17) {
    iVar2 = secp256k1_scalar_is_zero(na);
    w = (int)psVar6;
    if ((iVar2 == 0) && (a->infinity == 0)) {
      secp256k1_scalar_split_lambda
                ((secp256k1_scalar *)wnaf_ng_128,(secp256k1_scalar *)&local_d28,na);
      ps[0].bits_na_1 =
           secp256k1_ecmult_wnaf(ps[lVar15].wnaf_na_1,(int)wnaf_ng_128,(secp256k1_scalar *)0x5,w);
      ps[0].bits_na_lam =
           secp256k1_ecmult_wnaf(ps[lVar15].wnaf_na_lam,(int)&local_d28,(secp256k1_scalar *)0x5,w);
      if ((int)uVar4 < ps[0].bits_na_1) {
        uVar4 = ps[0].bits_na_1;
      }
      if ((int)uVar4 < ps[0].bits_na_lam) {
        uVar4 = ps[0].bits_na_lam;
      }
      bzinv = (secp256k1_fe *)(ulong)uVar4;
      psVar10 = a;
      psVar12 = (secp256k1_gej *)wnaf_ng_1;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (psVar12->x).n[0] = (psVar10->x).n[0];
        psVar10 = (secp256k1_gej *)((long)psVar10 + (ulong)bVar18 * -0x10 + 8);
        psVar12 = (secp256k1_gej *)((long)psVar12 + (ulong)bVar18 * -0x10 + 8);
      }
      if (lVar15 != 0) {
        secp256k1_gej_rescale((secp256k1_gej *)wnaf_ng_1,&Z);
      }
      psVar8 = aux + lVar15 * 8;
      psVar6 = &Z;
      secp256k1_ecmult_odd_multiples_table
                (8,pre_a + lVar15 * 8,psVar8,&Z,(secp256k1_gej *)wnaf_ng_1);
      if (lVar15 != 0) {
        secp256k1_fe_impl_mul(psVar8,psVar8,&a->z);
      }
      lVar15 = lVar15 + 1;
    }
    bVar17 = false;
  }
  if (lVar15 != 0) {
    secp256k1_ge_table_set_globalz(lVar15 * 8,pre_a,aux);
  }
  psVar8 = aux;
  psVar14 = pre_a;
  for (lVar5 = 0; iVar2 = (int)psVar6, lVar5 != lVar15; lVar5 = lVar5 + 1) {
    psVar11 = psVar14;
    for (lVar9 = 0; lVar9 != 0x140; lVar9 = lVar9 + 0x28) {
      secp256k1_fe_impl_mul
                ((secp256k1_fe *)((long)psVar8->n + lVar9),&psVar11->x,&secp256k1_const_beta);
      psVar11 = psVar11 + 1;
    }
    psVar8 = psVar8 + 8;
    psVar14 = psVar14 + 8;
  }
  if (ng == (secp256k1_scalar *)0x0) {
    uVar3 = 0;
    local_d44 = 0;
  }
  else {
    local_c88 = ng->d[0];
    uStack_c80 = ng->d[1];
    local_c78 = (undefined1  [16])0x0;
    local_ca8 = ng->d[2];
    uStack_ca0 = ng->d[3];
    local_c98 = (undefined1  [16])0x0;
    uVar3 = secp256k1_ecmult_wnaf(wnaf_ng_1,(int)&local_c88,(secp256k1_scalar *)0xf,iVar2);
    local_d44 = secp256k1_ecmult_wnaf(wnaf_ng_128,(int)&local_ca8,(secp256k1_scalar *)0xf,iVar2);
    if ((int)uVar4 < (int)uVar3) {
      uVar4 = uVar3;
    }
    if ((int)uVar4 < (int)local_d44) {
      uVar4 = local_d44;
    }
    bzinv = (secp256k1_fe *)(ulong)uVar4;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  lVar5 = (long)bzinv * 4;
  psVar6 = bzinv;
  while (iVar2 = (int)psVar6, 0 < iVar2) {
    psVar6 = (secp256k1_fe *)((long)psVar6[-1].n + 0x27);
    secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
    piVar16 = &ps[0].bits_na_lam;
    psVar14 = pre_a;
    psVar8 = aux;
    lVar9 = lVar15;
    while (bVar17 = lVar9 != 0, lVar9 = lVar9 + -1, bVar17) {
      if ((iVar2 <= piVar16[-1]) && (uVar4 = *(uint *)((long)piVar16 + lVar5 + -0x410), uVar4 != 0))
      {
        if ((int)uVar4 < 1) {
          psVar11 = psVar14 + (~uVar4 >> 1);
          psVar13 = &local_d28;
          for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
            (psVar13->x).n[0] = (psVar11->x).n[0];
            psVar11 = (secp256k1_ge *)((long)psVar11 + (ulong)bVar18 * -0x10 + 8);
            psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar18 * -0x10 + 8);
          }
          local_d28.y.n[0] = 0x3ffffbfffff0bc - local_d28.y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - local_d28.y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - local_d28.y.n[2];
          local_d28.y.n[3] = 0x3ffffffffffffc - local_d28.y.n[3];
          local_d28.y.n[4] = 0x3fffffffffffc - local_d28.y.n[4];
        }
        else {
          psVar11 = psVar14 + (uVar4 - 1 >> 1);
          psVar13 = &local_d28;
          for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
            (psVar13->x).n[0] = (psVar11->x).n[0];
            psVar11 = (secp256k1_ge *)((long)psVar11 + (ulong)bVar18 * -0x10 + 8);
            psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar18 * -0x10 + 8);
          }
        }
        bzinv = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var(r,r,&local_d28,(secp256k1_fe *)0x0);
      }
      if ((iVar2 <= *piVar16) && (uVar4 = *(uint *)((long)piVar16 + lVar5 + -0x20c), uVar4 != 0)) {
        local_d28.infinity = 0;
        if ((int)uVar4 < 1) {
          uVar4 = ~uVar4 >> 1;
          local_d28.x.n[4] = psVar8[uVar4].n[4];
          local_d28.x.n[0] = psVar8[uVar4].n[0];
          local_d28.x.n[1] = psVar8[uVar4].n[1];
          local_d28.x.n[2] = psVar8[uVar4].n[2];
          local_d28.x.n[3] = (psVar8[uVar4].n + 2)[1];
          puVar1 = psVar14[uVar4].y.n + 2;
          local_d28.y.n[0] = 0x3ffffbfffff0bc - psVar14[uVar4].y.n[0];
          local_d28.y.n[1] = 0x3ffffffffffffc - psVar14[uVar4].y.n[1];
          local_d28.y.n[2] = 0x3ffffffffffffc - *puVar1;
          local_d28.y.n[3] = 0x3ffffffffffffc - puVar1[1];
          local_d28.y.n[4] = 0x3fffffffffffc - psVar14[uVar4].y.n[4];
        }
        else {
          uVar4 = uVar4 - 1 >> 1;
          local_d28.x.n[4] = psVar8[uVar4].n[4];
          local_d28.x.n[0] = psVar8[uVar4].n[0];
          local_d28.x.n[1] = psVar8[uVar4].n[1];
          local_d28.x.n[2] = psVar8[uVar4].n[2];
          local_d28.x.n[3] = (psVar8[uVar4].n + 2)[1];
          local_d28.y.n[4] = psVar14[uVar4].y.n[4];
          local_d28.y.n[0] = psVar14[uVar4].y.n[0];
          local_d28.y.n[1] = psVar14[uVar4].y.n[1];
          puVar1 = psVar14[uVar4].y.n + 2;
          local_d28.y.n[2] = *puVar1;
          local_d28.y.n[3] = puVar1[1];
        }
        bzinv = (secp256k1_fe *)0x0;
        secp256k1_gej_add_ge_var(r,r,&local_d28,(secp256k1_fe *)0x0);
      }
      psVar8 = psVar8 + 8;
      psVar14 = psVar14 + 8;
      piVar16 = piVar16 + 0x104;
    }
    if ((iVar2 <= (int)uVar3) && (wnaf_ng_1[(long)psVar6] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                (&local_d28,secp256k1_pre_g,wnaf_ng_1[(long)psVar6],(int)bzinv);
      bzinv = &Z;
      secp256k1_gej_add_zinv_var(r,r,&local_d28,bzinv);
    }
    if ((iVar2 <= (int)local_d44) && (wnaf_ng_128[(long)psVar6] != 0)) {
      secp256k1_ecmult_table_get_ge_storage
                (&local_d28,secp256k1_pre_g_128,wnaf_ng_128[(long)psVar6],(int)bzinv);
      bzinv = &Z;
      secp256k1_gej_add_zinv_var(r,r,&local_d28,bzinv);
    }
    lVar5 = lVar5 + -4;
  }
  if (r->infinity == 0) {
    secp256k1_fe_impl_mul(&r->z,&r->z,&Z);
  }
  return;
}

Assistant:

static void secp256k1_ecmult(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_fe aux[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    struct secp256k1_strauss_point_state ps[1];
    struct secp256k1_strauss_state state;

    state.aux = aux;
    state.pre_a = pre_a;
    state.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&state, r, 1, a, na, ng);
}